

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O1

size_t pem2der(char *pem,size_t len,uchar *out)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  
  pcVar1 = strstr(pem,"-----BEGIN");
  pcVar2 = strstr(pem,"-----END");
  if (pcVar2 != (char *)0x0 && pcVar1 != (char *)0x0) {
    pcVar4 = pem + len;
    for (pcVar1 = pcVar1 + 10; (pcVar1 < pcVar4 && (*pcVar1 != '-')); pcVar1 = pcVar1 + 1) {
    }
    for (; (pcVar1 < pcVar4 && (*pcVar1 == '-')); pcVar1 = pcVar1 + 1) {
    }
    pcVar1 = pcVar1 + (ulong)(pcVar1[*pcVar1 == '\r'] == '\n') + (ulong)(*pcVar1 == '\r');
    if (pcVar2 <= pcVar4 && (pcVar1 <= pcVar2 && (long)pcVar2 - (long)pcVar1 != 0)) {
      sVar3 = base64_decode(pcVar1,(long)pcVar2 - (long)pcVar1,out);
      return sVar3;
    }
  }
  return 0;
}

Assistant:

size_t pem2der(const char* pem, size_t len, unsigned char* out)
{
	const char* end = pem + len;
	const char* s1 = strstr(pem, "-----BEGIN");
	const char* s2 = strstr(pem, "-----END");

	if(s1 == NULL)
		return 0;

	if(s2 == NULL)
		return 0;

	s1 += 10;

	while(s1 < end && *s1 != '-')
		s1++;

	while(s1 < end && *s1 == '-')
		s1++;

	if(*s1 == '\r') s1++;
	if(*s1 == '\n') s1++;

	if(s2 <= s1 || s2 > end)
		return 0;

	return base64_decode(s1, (size_t)(s2 - s1), (unsigned char*)out);
}